

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_listener_close(nng_listener lid)

{
  int iVar1;
  nni_listener *local_10;
  nni_listener *l;
  
  iVar1 = nni_listener_find(&local_10,lid.id);
  if (iVar1 == 0) {
    nni_listener_close(local_10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_listener_close(nng_listener lid)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	nni_listener_close(l);
	return (0);
}